

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O3

unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>,_true> __thiscall
duckdb::SecretManager::GetSecretByName
          (SecretManager *this,CatalogTransaction transaction,string *name,string *storage)

{
  pointer pcVar1;
  SecretEntry *__ptr;
  SecretEntry *pSVar2;
  pointer __p;
  InternalException *this_00;
  InvalidInputException *this_01;
  string *in_RCX;
  bool bVar3;
  pointer prVar4;
  optional_ptr<duckdb::SecretStorage,_true> storage_lookup;
  SecretEntry *local_c0;
  SecretEntry *local_b8;
  vector<std::reference_wrapper<duckdb::SecretStorage>,_true> local_b0;
  string local_98;
  _Head_base<0UL,_duckdb::SecretEntry_*,_false> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  InitializeSecrets((SecretManager *)name,transaction);
  local_c0 = (SecretEntry *)0x0;
  if (in_RCX->_M_string_length == 0) {
    GetSecretStorages(&local_b0,(SecretManager *)name);
    if (local_b0.
        super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_b0.
        super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = false;
      prVar4 = local_b0.
               super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_78._M_head_impl = (SecretEntry *)this;
      do {
        (*prVar4->_M_data->_vptr_SecretStorage[7])
                  ((default_delete<duckdb::SecretEntry> *)&local_b8,prVar4->_M_data,storage,
                   &transaction);
        pSVar2 = local_b8;
        __ptr = local_c0;
        if (local_b8 != (SecretEntry *)0x0) {
          if (bVar3) {
            this_00 = (InternalException *)__cxa_allocate_exception(0x10);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Ambiguity detected for secret name \'%s\', secret occurs in multiple storage backends."
                       ,"");
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            pcVar1 = (storage->_M_dataplus)._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar1,pcVar1 + storage->_M_string_length);
            InternalException::InternalException<std::__cxx11::string>(this_00,&local_98,&local_70);
            __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          local_b8 = (SecretEntry *)0x0;
          local_c0 = pSVar2;
          bVar3 = true;
          if ((__ptr != (SecretEntry *)0x0) &&
             (::std::default_delete<duckdb::SecretEntry>::operator()
                        ((default_delete<duckdb::SecretEntry> *)&local_c0,__ptr),
             local_b8 != (SecretEntry *)0x0)) {
            ::std::default_delete<duckdb::SecretEntry>::operator()
                      ((default_delete<duckdb::SecretEntry> *)&local_b8,local_b8);
          }
        }
        prVar4 = prVar4 + 1;
        this = (SecretManager *)local_78._M_head_impl;
      } while (prVar4 != local_b0.
                         super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                         .
                         super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_b0.
        super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.
                      super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                      .
                      super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    *(SecretEntry **)this = local_c0;
  }
  else {
    local_b0.
    super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    .
    super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)GetSecretStorage((SecretManager *)name,in_RCX);
    if ((SecretStorage *)
        local_b0.
        super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (SecretStorage *)0x0) {
      this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,"Unknown secret storage found: \'%s\'","");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (in_RCX->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + in_RCX->_M_string_length);
      InvalidInputException::InvalidInputException<std::__cxx11::string>
                (this_01,&local_98,&local_50);
      __cxa_throw(this_01,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::SecretStorage,_true>::CheckValid
              ((optional_ptr<duckdb::SecretStorage,_true> *)&local_b0);
    (**(_func_int **)
       ((long)(local_b0.
               super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
               .
               super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_data + 0x38))
              (this,local_b0.
                    super_vector<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                    .
                    super__Vector_base<std::reference_wrapper<duckdb::SecretStorage>,_std::allocator<std::reference_wrapper<duckdb::SecretStorage>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,storage,&transaction);
    if (local_c0 != (SecretEntry *)0x0) {
      ::std::default_delete<duckdb::SecretEntry>::operator()
                ((default_delete<duckdb::SecretEntry> *)&local_c0,local_c0);
    }
  }
  return (unique_ptr<duckdb::SecretEntry,_std::default_delete<duckdb::SecretEntry>_>)
         (_Tuple_impl<0UL,_duckdb::SecretEntry_*,_std::default_delete<duckdb::SecretEntry>_>)this;
}

Assistant:

unique_ptr<SecretEntry> SecretManager::GetSecretByName(CatalogTransaction transaction, const string &name,
                                                       const string &storage) {
	InitializeSecrets(transaction);

	unique_ptr<SecretEntry> result = nullptr;
	bool found = false;

	if (!storage.empty()) {
		auto storage_lookup = GetSecretStorage(storage);

		if (!storage_lookup) {
			throw InvalidInputException("Unknown secret storage found: '%s'", storage);
		}

		return storage_lookup->GetSecretByName(name, &transaction);
	}

	for (const auto &storage_ref : GetSecretStorages()) {
		auto lookup = storage_ref.get().GetSecretByName(name, &transaction);
		if (lookup) {
			if (found) {
				throw InternalException(
				    "Ambiguity detected for secret name '%s', secret occurs in multiple storage backends.", name);
			}

			result = std::move(lookup);
			found = true;
		}
	}

	return result;
}